

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void nlohmann::detail::
     serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
     ::escape_codepoint(int codepoint,string_t *result,size_t *pos)

{
  value_type_conflict vVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  const_reference pvVar7;
  value_type_conflict *pvVar8;
  bool local_29;
  int low_surrogate;
  int high_surrogate;
  size_t *pos_local;
  string_t *result_local;
  int codepoint_local;
  
  local_29 = 0x10ffff < (uint)codepoint;
  if (local_29) {
    __assert_fail("0x00 <= codepoint and codepoint <= 0x10FFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                  ,0x1916,
                  "static void nlohmann::detail::serializer<nlohmann::basic_json<>>::escape_codepoint(int, string_t &, std::size_t &) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)result);
  if (*pcVar5 == '\\') {
    *pos = *pos + 1;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)result);
    *puVar6 = 0x75;
    if (codepoint < 0x10000) {
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)(codepoint >> 0xc & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)(codepoint >> 8 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)(codepoint >> 4 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)(codepoint & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
    }
    else {
      uVar2 = codepoint - 0x10000;
      uVar3 = (int)uVar2 >> 10 & 0x3ffU | 0xd800;
      uVar4 = uVar2 & 0x3ff | 0xdc00;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)((int)uVar3 >> 0xc));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)((int)uVar3 >> 8 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)((int)uVar3 >> 4 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)((int)uVar2 >> 10 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      *pos = *pos + 1;
      *pos = *pos + 1;
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)result);
      *puVar6 = 0x75;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)((int)uVar4 >> 0xc));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)((int)uVar4 >> 8 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)((int)uVar4 >> 4 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
      pvVar7 = std::array<char,_16UL>::operator[]
                         (&escape_codepoint::hexify,(long)(int)(uVar2 & 0xf));
      vVar1 = *pvVar7;
      *pos = *pos + 1;
      pvVar8 = (value_type_conflict *)std::__cxx11::string::operator[]((ulong)result);
      *pvVar8 = vVar1;
    }
    *pos = *pos + 1;
    return;
  }
  __assert_fail("result[pos] == \'\\\\\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh",
                0x1919,
                "static void nlohmann::detail::serializer<nlohmann::basic_json<>>::escape_codepoint(int, string_t &, std::size_t &) [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

static void escape_codepoint(int codepoint, string_t& result, std::size_t& pos)
    {
        // expecting a proper codepoint
        assert(0x00 <= codepoint and codepoint <= 0x10FFFF);

        // the last written character was the backslash before the 'u'
        assert(result[pos] == '\\');

        // write the 'u'
        result[++pos] = 'u';

        // convert a number 0..15 to its hex representation (0..f)
        static const std::array<char, 16> hexify =
        {
            {
                '0', '1', '2', '3', '4', '5', '6', '7',
                '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'
            }
        };

        if (codepoint < 0x10000)
        {
            // codepoints U+0000..U+FFFF can be represented as \uxxxx.
            result[++pos] = hexify[(codepoint >> 12) & 0x0F];
            result[++pos] = hexify[(codepoint >> 8) & 0x0F];
            result[++pos] = hexify[(codepoint >> 4) & 0x0F];
            result[++pos] = hexify[codepoint & 0x0F];
        }
        else
        {
            // codepoints U+10000..U+10FFFF need a surrogate pair to be
            // represented as \uxxxx\uxxxx.
            // http://www.unicode.org/faq/utf_bom.html#utf16-4
            codepoint -= 0x10000;
            const int high_surrogate = 0xD800 | ((codepoint >> 10) & 0x3FF);
            const int low_surrogate = 0xDC00 | (codepoint & 0x3FF);
            result[++pos] = hexify[(high_surrogate >> 12) & 0x0F];
            result[++pos] = hexify[(high_surrogate >> 8) & 0x0F];
            result[++pos] = hexify[(high_surrogate >> 4) & 0x0F];
            result[++pos] = hexify[high_surrogate & 0x0F];
            ++pos;  // backslash is already in output
            result[++pos] = 'u';
            result[++pos] = hexify[(low_surrogate >> 12) & 0x0F];
            result[++pos] = hexify[(low_surrogate >> 8) & 0x0F];
            result[++pos] = hexify[(low_surrogate >> 4) & 0x0F];
            result[++pos] = hexify[low_surrogate & 0x0F];
        }

        ++pos;
    }